

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

void QuaternionToAxisAngle(Quaternion q,Vector3 *outAxis,float *outAngle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 local_48;
  
  fVar4 = q.z;
  fVar5 = q.w;
  fVar2 = q.x;
  fVar3 = q.y;
  local_48 = q._0_8_;
  if (1.0 < ABS(fVar5)) {
    fVar1 = fVar5 * fVar5 + fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = (float)(-(uint)(fVar1 == 0.0) & 0x3f800000 |
                   ~-(uint)(fVar1 == 0.0) & (uint)(1.0 / fVar1));
    local_48 = CONCAT44(fVar3 * fVar1,fVar2 * fVar1);
    fVar4 = fVar4 * fVar1;
    fVar5 = fVar5 * fVar1;
  }
  fVar2 = acosf(fVar5);
  fVar3 = 1.0 - fVar5 * fVar5;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar5 = 1.0;
  if (0.0001 < fVar3) {
    fVar5 = (float)local_48 / fVar3;
  }
  if (0.0001 < fVar3) {
    fVar4 = fVar4 / fVar3;
  }
  else {
    fVar4 = 0.0;
  }
  outAxis->x = fVar5;
  outAxis->y = (float)(-(uint)(0.0001 < fVar3) & (uint)(local_48._4_4_ / fVar3));
  outAxis->z = fVar4;
  *outAngle = fVar2 + fVar2;
  return;
}

Assistant:

RMDEF void QuaternionToAxisAngle(Quaternion q, Vector3 *outAxis, float *outAngle)
{
    if (fabs(q.w) > 1.0f) q = QuaternionNormalize(q);

    Vector3 resAxis = { 0.0f, 0.0f, 0.0f };
    float resAngle = 2.0f*acosf(q.w);
    float den = sqrtf(1.0f - q.w*q.w);

    if (den > 0.0001f)
    {
        resAxis.x = q.x/den;
        resAxis.y = q.y/den;
        resAxis.z = q.z/den;
    }
    else
    {
        // This occurs when the angle is zero.
        // Not a problem: just set an arbitrary normalized axis.
        resAxis.x = 1.0f;
    }

    *outAxis = resAxis;
    *outAngle = resAngle;
}